

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildFieldOrExtension
          (DescriptorBuilder *this,FieldDescriptorProto *proto,Descriptor *parent,
          FieldDescriptor *result,bool is_extension)

{
  int iVar1;
  Tables *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  double dVar3;
  Symbol symbol;
  __type_conflict _Var4;
  char cVar5;
  bool bVar6;
  uint uVar7;
  CppType CVar8;
  undefined4 uVar9;
  Type TVar10;
  Descriptor *pDVar11;
  string *psVar12;
  string *psVar13;
  long lVar14;
  undefined1 *orig_options;
  undefined7 in_register_00000081;
  float fVar16;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 uVar18;
  SubstituteArg *pSVar17;
  SubstituteArg local_268;
  string local_238;
  string *local_218;
  SubstituteArg local_210;
  char *end_pos;
  int local_1d8;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  FieldDescriptor *pFStack_1a8;
  string lowercase_name;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  ulong uVar15;
  
  uVar18 = (undefined4)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  pDVar11 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar11 = (Descriptor *)this->file_;
  }
  psVar12 = AllocateNameString(this,*(string **)(pDVar11 + 8),(proto->name_).ptr_);
  ValidateSymbolName(this,(proto->name_).ptr_,psVar12,&proto->super_Message);
  psVar13 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = psVar13;
  *(string **)(result + 8) = psVar12;
  *(FileDescriptor **)(result + 0x28) = this->file_;
  *(int32 *)(result + 0x44) = proto->number_;
  result[0x42] = (FieldDescriptor)is_extension;
  std::__cxx11::string::string((string *)&lowercase_name,(string *)(proto->name_).ptr_);
  LowerString(&lowercase_name);
  _Var4 = std::operator==(&lowercase_name,(proto->name_).ptr_);
  if (_Var4) {
    psVar12 = *(string **)result;
  }
  else {
    psVar12 = DescriptorPool::Tables::AllocateString(this->tables_,&lowercase_name);
  }
  *(string **)(result + 0x10) = psVar12;
  pTVar2 = this->tables_;
  anon_unknown_1::ToCamelCase((string *)&local_268,(proto->name_).ptr_,true);
  psVar12 = DescriptorPool::Tables::AllocateString(pTVar2,(string *)&local_268);
  *(string **)(result + 0x18) = psVar12;
  std::__cxx11::string::~string((string *)&local_268);
  if (((proto->_has_bits_).has_bits_[0] & 0x10) == 0) {
    result[0x41] = (FieldDescriptor)0x0;
    pTVar2 = this->tables_;
    anon_unknown_1::ToJsonName((string *)&local_268,(proto->name_).ptr_);
    psVar12 = DescriptorPool::Tables::AllocateString(pTVar2,(string *)&local_268);
    *(string **)(result + 0x20) = psVar12;
    std::__cxx11::string::~string((string *)&local_268);
  }
  else {
    result[0x41] = (FieldDescriptor)0x1;
    psVar12 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->json_name_).ptr_);
    *(string **)(result + 0x20) = psVar12;
  }
  *(int *)(result + 0x38) = proto->type_;
  iVar1 = proto->label_;
  *(int *)(result + 0x3c) = iVar1;
  if ((iVar1 == 2 & (byte)result[0x42]) == 1) {
    psVar12 = *(string **)(result + 8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210,
                   "The extension ",psVar12);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210,
                   " cannot be required.");
    AddError(this,psVar12,&proto->super_Message,TYPE,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_210);
  }
  *(undefined8 *)(result + 0x50) = 0;
  *(undefined8 *)(result + 0x30) = 0;
  *(undefined8 *)(result + 0x70) = 0;
  *(undefined8 *)(result + 0x60) = 0;
  *(undefined8 *)(result + 0x68) = 0;
  *(undefined8 *)(result + 0x90) = 0;
  *(undefined8 *)(result + 0x80) = 0;
  *(undefined8 *)(result + 0x88) = 0;
  uVar7 = (proto->_has_bits_).has_bits_[0];
  result[0x40] = SUB41((uVar7 & 8) >> 3,0);
  if (((uVar7 & 8) != 0) && (*(int *)(result + 0x3c) == 3)) {
    AddError(this,*(string **)(result + 8),&proto->super_Message,DEFAULT_VALUE,
             "Repeated fields can\'t have default values.");
    uVar7 = (proto->_has_bits_).has_bits_[0];
  }
  if ((uVar7 >> 9 & 1) == 0) goto switchD_00298546_default;
  if ((uVar7 & 8) == 0) {
    CVar8 = FieldDescriptor::cpp_type(result);
    switch(CVar8) {
    case CPPTYPE_INT32:
    case CPPTYPE_UINT32:
    case CPPTYPE_FLOAT:
      *(undefined4 *)(result + 0x90) = 0;
      break;
    case CPPTYPE_INT64:
    case CPPTYPE_UINT64:
    case CPPTYPE_DOUBLE:
    case CPPTYPE_ENUM:
      *(undefined8 *)(result + 0x90) = 0;
      break;
    case CPPTYPE_BOOL:
      result[0x90] = (FieldDescriptor)0x0;
      break;
    case CPPTYPE_STRING:
      internal::InitProtobufDefaults();
      *(undefined1 **)(result + 0x90) = internal::fixed_address_empty_string_abi_cxx11_;
    }
    goto switchD_00298546_default;
  }
  end_pos = (char *)0x0;
  CVar8 = FieldDescriptor::cpp_type(result);
  switch(CVar8) {
  case CPPTYPE_INT32:
    lVar14 = strtol((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos,0);
    uVar9 = (undefined4)lVar14;
    goto LAB_00298982;
  case CPPTYPE_INT64:
    psVar12 = (string *)strtoll((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos,0);
    goto LAB_00298b02;
  case CPPTYPE_UINT32:
    uVar15 = strtoul((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos,0);
    uVar9 = (undefined4)uVar15;
LAB_00298982:
    *(undefined4 *)(result + 0x90) = uVar9;
    break;
  case CPPTYPE_UINT64:
    psVar12 = (string *)strtoull((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos,0);
    goto LAB_00298b02;
  case CPPTYPE_DOUBLE:
    bVar6 = std::operator==((proto->default_value_).ptr_,"inf");
    if (bVar6) {
      psVar12 = (string *)0x7ff0000000000000;
    }
    else {
      bVar6 = std::operator==((proto->default_value_).ptr_,"-inf");
      if (bVar6) {
        psVar12 = (string *)0xfff0000000000000;
      }
      else {
        bVar6 = std::operator==((proto->default_value_).ptr_,"nan");
        if (!bVar6) {
          dVar3 = io::NoLocaleStrtod((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos);
          *(double *)(result + 0x90) = dVar3;
          break;
        }
        psVar12 = (string *)0x7ff8000000000000;
      }
    }
LAB_00298b02:
    *(string **)(result + 0x90) = psVar12;
    break;
  case CPPTYPE_FLOAT:
    bVar6 = std::operator==((proto->default_value_).ptr_,"inf");
    if (bVar6) {
      *(undefined4 *)(result + 0x90) = 0x7f800000;
    }
    else {
      bVar6 = std::operator==((proto->default_value_).ptr_,"-inf");
      if (bVar6) {
        *(undefined4 *)(result + 0x90) = 0xff800000;
      }
      else {
        bVar6 = std::operator==((proto->default_value_).ptr_,"nan");
        if (bVar6) {
          *(undefined4 *)(result + 0x90) = 0x7fc00000;
        }
        else {
          dVar3 = io::NoLocaleStrtod((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos);
          fVar16 = io::SafeDoubleToFloat(dVar3);
          *(float *)(result + 0x90) = fVar16;
        }
      }
    }
    break;
  case CPPTYPE_BOOL:
    bVar6 = std::operator==((proto->default_value_).ptr_,"true");
    if (bVar6) {
      result[0x90] = (FieldDescriptor)0x1;
    }
    else {
      bVar6 = std::operator==((proto->default_value_).ptr_,"false");
      if (bVar6) {
        result[0x90] = (FieldDescriptor)0x0;
      }
      else {
        AddError(this,*(string **)(result + 8),&proto->super_Message,DEFAULT_VALUE,
                 "Boolean default must be true or false.");
      }
    }
    break;
  case CPPTYPE_ENUM:
    *(undefined8 *)(result + 0x90) = 0;
    break;
  case CPPTYPE_STRING:
    TVar10 = FieldDescriptor::type(result);
    pTVar2 = this->tables_;
    if (TVar10 != TYPE_BYTES) {
      psVar12 = DescriptorPool::Tables::AllocateString(pTVar2,(proto->default_value_).ptr_);
      goto LAB_00298b02;
    }
    UnescapeCEscapeString((string *)&local_268,(proto->default_value_).ptr_);
    psVar12 = DescriptorPool::Tables::AllocateString(pTVar2,(string *)&local_268);
    *(string **)(result + 0x90) = psVar12;
    std::__cxx11::string::~string((string *)&local_268);
    break;
  case CPPTYPE_MESSAGE:
    AddError(this,*(string **)(result + 8),&proto->super_Message,DEFAULT_VALUE,
             "Messages can\'t have default values.");
    result[0x40] = (FieldDescriptor)0x0;
  }
  if ((end_pos != (char *)0x0) &&
     ((__rhs = (proto->default_value_).ptr_, __rhs->_M_string_length == 0 || (*end_pos != '\0')))) {
    psVar12 = *(string **)(result + 8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210,
                   "Couldn\'t parse default value \"",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210,
                   "\".");
    AddError(this,psVar12,&proto->super_Message,DEFAULT_VALUE,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_210);
  }
switchD_00298546_default:
  uVar7 = *(uint *)(result + 0x44);
  if ((int)uVar7 < 1) {
    AddError(this,*(string **)(result + 8),&proto->super_Message,NUMBER,
             "Field numbers must be positive integers.");
LAB_00298570:
    uVar7 = (proto->_has_bits_).has_bits_[0];
    cVar5 = (char)uVar7;
    if (is_extension == false) goto LAB_002986cb;
    if ((uVar7 & 2) == 0) {
      AddError(this,*(string **)(result + 8),&proto->super_Message,EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
      cVar5 = (char)(proto->_has_bits_).has_bits_[0];
    }
    *(Descriptor **)(result + 0x60) = parent;
    if (cVar5 < '\0') {
      AddError(this,*(string **)(result + 8),&proto->super_Message,TYPE,
               "FieldDescriptorProto.oneof_index should not be set for extensions.");
    }
  }
  else {
    if (uVar7 < 0x20000000 || is_extension) {
      if (uVar7 - 19000 < 1000) {
        psVar12 = *(string **)(result + 8);
        strings::internal::SubstituteArg::SubstituteArg(&local_268,19000);
        pSVar17 = (SubstituteArg *)CONCAT44(uVar18,(int)CONCAT71(in_register_00000081,is_extension))
        ;
        local_218 = psVar12;
        strings::internal::SubstituteArg::SubstituteArg(&local_210,19999);
        end_pos = (char *)0x0;
        local_1d8 = -1;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_238,
                   (strings *)
                   "Field numbers $0 through $1 are reserved for the protocol buffer library implementation."
                   ,(char *)&local_268,&local_210,(SubstituteArg *)&end_pos,&local_60,&local_90,
                   &local_c0,&local_f0,&local_120,&local_150,&local_180,pSVar17);
        is_extension = SUB81(pSVar17,0);
        AddError(this,local_218,&proto->super_Message,NUMBER,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
      }
      goto LAB_00298570;
    }
    pSVar17 = *(SubstituteArg **)(result + 8);
    strings::internal::SubstituteArg::SubstituteArg(&local_268,0x1fffffff);
    local_210.text_ = (char *)0x0;
    local_210.size_ = -1;
    end_pos = (char *)0x0;
    local_1d8 = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_238,(strings *)"Field numbers cannot be greater than $0.",(char *)&local_268,
               &local_210,(SubstituteArg *)&end_pos,&local_60,&local_90,&local_c0,&local_f0,
               &local_120,&local_150,&local_180,pSVar17);
    AddError(this,(string *)pSVar17,&proto->super_Message,NUMBER,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    uVar7 = (proto->_has_bits_).has_bits_[0];
LAB_002986cb:
    cVar5 = (char)uVar7;
    if ((uVar7 & 2) != 0) {
      AddError(this,*(string **)(result + 8),&proto->super_Message,EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
      cVar5 = (char)(proto->_has_bits_).has_bits_[0];
    }
    *(Descriptor **)(result + 0x50) = parent;
    if (cVar5 < '\0') {
      iVar1 = proto->oneof_index_;
      if (((long)iVar1 < 0) || (*(int *)(parent + 0x6c) <= iVar1)) {
        pSVar17 = *(SubstituteArg **)(result + 8);
        strings::internal::SubstituteArg::SubstituteArg(&local_268,iVar1);
        local_210.text_ = (char *)**(undefined8 **)parent;
        local_210.size_ = *(int *)(*(undefined8 **)parent + 1);
        end_pos = (char *)0x0;
        local_1d8 = -1;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_238,
                   (strings *)"FieldDescriptorProto.oneof_index $0 is out of range for type \"$1\"."
                   ,(char *)&local_268,&local_210,(SubstituteArg *)&end_pos,&local_60,&local_90,
                   &local_c0,&local_f0,&local_120,&local_150,&local_180,pSVar17);
        AddError(this,(string *)pSVar17,&proto->super_Message,TYPE,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        lVar14 = 0;
      }
      else {
        lVar14 = (long)iVar1 * 0x30 + *(long *)(parent + 0x30);
      }
      goto LAB_0029885f;
    }
  }
  lVar14 = 0;
LAB_0029885f:
  *(long *)(result + 0x58) = lVar14;
  if (((proto->_has_bits_).has_bits_[0] & 0x20) == 0) {
    *(undefined8 *)(result + 0x78) = 0;
  }
  else {
    orig_options = (undefined1 *)proto->options_;
    if ((FieldOptions *)orig_options == (FieldOptions *)0x0) {
      orig_options = _FieldOptions_default_instance_;
    }
    AllocateOptions<google::protobuf::FieldDescriptor>(this,(OptionsType *)orig_options,result,8);
  }
  local_1b0 = 2;
  symbol._4_4_ = uStack_1ac;
  symbol.type = 2;
  symbol.field_1.field_descriptor = result;
  pFStack_1a8 = result;
  AddSymbol(this,*(string **)(result + 8),parent,*(string **)result,&proto->super_Message,symbol);
  std::__cxx11::string::~string((string *)&lowercase_name);
  return;
}

Assistant:

void DescriptorBuilder::BuildFieldOrExtension(const FieldDescriptorProto& proto,
                                              const Descriptor* parent,
                                              FieldDescriptor* result,
                                              bool is_extension) {
  const std::string& scope =
      (parent == nullptr) ? file_->package() : parent->full_name();
  std::string* full_name = AllocateNameString(scope, proto.name());
  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_ = tables_->AllocateString(proto.name());
  result->full_name_ = full_name;
  result->file_ = file_;
  result->number_ = proto.number();
  result->is_extension_ = is_extension;

  // If .proto files follow the style guide then the name should already be
  // lower-cased.  If that's the case we can just reuse the string we
  // already allocated rather than allocate a new one.
  std::string lowercase_name(proto.name());
  LowerString(&lowercase_name);
  if (lowercase_name == proto.name()) {
    result->lowercase_name_ = result->name_;
  } else {
    result->lowercase_name_ = tables_->AllocateString(lowercase_name);
  }

  // Don't bother with the above optimization for camel-case names since
  // .proto files that follow the guide shouldn't be using names in this
  // format, so the optimization wouldn't help much.
  result->camelcase_name_ =
      tables_->AllocateString(ToCamelCase(proto.name(),
                                          /* lower_first = */ true));

  if (proto.has_json_name()) {
    result->has_json_name_ = true;
    result->json_name_ = tables_->AllocateString(proto.json_name());
  } else {
    result->has_json_name_ = false;
    result->json_name_ = tables_->AllocateString(ToJsonName(proto.name()));
  }

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  result->type_ = static_cast<FieldDescriptor::Type>(
      implicit_cast<int>(proto.type()));
  result->label_ = static_cast<FieldDescriptor::Label>(
      implicit_cast<int>(proto.label()));

  // An extension cannot have a required field (b/13365836).
  if (result->is_extension_ &&
      result->label_ == FieldDescriptor::LABEL_REQUIRED) {
    AddError(result->full_name(), proto,
             // Error location `TYPE`: we would really like to indicate
             // `LABEL`, but the `ErrorLocation` enum has no entry for this, and
             // we don't necessarily know about all implementations of the
             // `ErrorCollector` interface to extend them to handle the new
             // error location type properly.
             DescriptorPool::ErrorCollector::TYPE,
             "The extension " + result->full_name() + " cannot be required.");
  }

  // Some of these may be filled in when cross-linking.
  result->containing_type_ = nullptr;
  result->extension_scope_ = nullptr;
  result->message_type_ = nullptr;
  result->enum_type_ = nullptr;
  result->type_name_ = nullptr;
  result->type_once_ = nullptr;
  result->default_value_enum_ = nullptr;
  result->default_value_enum_name_ = nullptr;

  result->has_default_value_ = proto.has_default_value();
  if (proto.has_default_value() && result->is_repeated()) {
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Repeated fields can't have default values.");
  }

  if (proto.has_type()) {
    if (proto.has_default_value()) {
      char* end_pos = nullptr;
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ =
              strtol(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ =
              strto64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ =
              strtoul(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ =
              strtou64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          if (proto.default_value() == "inf") {
            result->default_value_float_ =
                std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_float_ =
                -std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_float_ =
                std::numeric_limits<float>::quiet_NaN();
          } else {
            result->default_value_float_ = io::SafeDoubleToFloat(
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos));
          }
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          if (proto.default_value() == "inf") {
            result->default_value_double_ =
                std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_double_ =
                -std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_double_ =
                std::numeric_limits<double>::quiet_NaN();
          } else {
            result->default_value_double_ =
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          if (proto.default_value() == "true") {
            result->default_value_bool_ = true;
          } else if (proto.default_value() == "false") {
            result->default_value_bool_ = false;
          } else {
            AddError(result->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = nullptr;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          if (result->type() == FieldDescriptor::TYPE_BYTES) {
            result->default_value_string_ = tables_->AllocateString(
                UnescapeCEscapeString(proto.default_value()));
          } else {
            result->default_value_string_ =
                tables_->AllocateString(proto.default_value());
          }
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Messages can't have default values.");
          result->has_default_value_ = false;
          break;
      }

      if (end_pos != nullptr) {
        // end_pos is only set non-null by the parsers for numeric types,
        // above. This checks that the default was non-empty and had no extra
        // junk after the end of the number.
        if (proto.default_value().empty() || *end_pos != '\0') {
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Couldn't parse default value \"" + proto.default_value() +
                       "\".");
        }
      }
    } else {
      // No explicit default value
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          result->default_value_float_ = 0.0f;
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          result->default_value_double_ = 0.0;
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          result->default_value_bool_ = false;
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = nullptr;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          result->default_value_string_ = &internal::GetEmptyString();
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          break;
      }
    }
  }

  if (result->number() <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Field numbers must be positive integers.");
  } else if (!is_extension && result->number() > FieldDescriptor::kMaxNumber) {
    // Only validate that the number is within the valid field range if it is
    // not an extension. Since extension numbers are validated with the
    // extendee's valid set of extension numbers, and those are in turn
    // validated against the max allowed number, the check is unnecessary for
    // extension fields.
    // This avoids cross-linking issues that arise when attempting to check if
    // the extendee is a message_set_wire_format message, which has a higher max
    // on extension numbers.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute("Field numbers cannot be greater than $0.",
                                 FieldDescriptor::kMaxNumber));
  } else if (result->number() >= FieldDescriptor::kFirstReservedNumber &&
             result->number() <= FieldDescriptor::kLastReservedNumber) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute(
                 "Field numbers $0 through $1 are reserved for the protocol "
                 "buffer library implementation.",
                 FieldDescriptor::kFirstReservedNumber,
                 FieldDescriptor::kLastReservedNumber));
  }

  if (is_extension) {
    if (!proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }

    result->extension_scope_ = parent;

    if (proto.has_oneof_index()) {
      AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "FieldDescriptorProto.oneof_index should not be set for "
               "extensions.");
    }

    // Fill in later (maybe).
    result->containing_oneof_ = nullptr;
  } else {
    if (proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }

    result->containing_type_ = parent;

    if (proto.has_oneof_index()) {
      if (proto.oneof_index() < 0 ||
          proto.oneof_index() >= parent->oneof_decl_count()) {
        AddError(result->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 strings::Substitute("FieldDescriptorProto.oneof_index $0 is "
                                     "out of range for type \"$1\".",
                                     proto.oneof_index(), parent->name()));
        result->containing_oneof_ = nullptr;
      } else {
        result->containing_oneof_ = parent->oneof_decl(proto.oneof_index());
      }
    } else {
      result->containing_oneof_ = nullptr;
    }
  }

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = nullptr;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result,
                    FieldDescriptorProto::kOptionsFieldNumber);
  }


  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));
}